

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params)

{
  size_t elementCount;
  long lVar1;
  char *__dest;
  
  lVar1 = *(long *)(this + 8);
  elementCount = lVar1 + 1;
  __dest = (char *)HeapArrayDisposer::allocateImpl
                             (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
  __dest[lVar1] = '\0';
  (__return_storage_ptr__->content).ptr = __dest;
  (__return_storage_ptr__->content).size_ = elementCount;
  (__return_storage_ptr__->content).disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  if (*(size_t *)(this + 8) != 0) {
    if (elementCount == 0) {
      __dest = (char *)0x0;
    }
    memcpy(__dest,*(void **)this,*(size_t *)(this + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}